

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

double xc_cheb_eval(double x,double *cs,int N)

{
  long lVar1;
  double dVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar2 = 0.0;
  dVar5 = 0.0;
  dVar6 = 0.0;
  for (uVar3 = (ulong)(uint)N; dVar4 = dVar2, 0 < (int)uVar3; uVar3 = uVar3 - 1) {
    lVar1 = uVar3 - 1;
    dVar2 = dVar5;
    dVar5 = ((x + x) * dVar5 - dVar4) + cs[lVar1];
    dVar6 = dVar4;
  }
  return (dVar5 - dVar6) * 0.5;
}

Assistant:

GPU_FUNCTION
static inline double
xc_cheb_eval(const double x, const double *cs, const int N)
{
  int i;
  double twox, b0, b1, b2;

  b2 = b1 = b0 = 0.0;

  twox = 2.0*x;
  for(i=N-1; i>=0; i--){
    b2 = b1;
    b1 = b0;
    b0 = twox*b1 - b2 + cs[i];
  }

  return 0.5*(b0 - b2);
}